

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easylogging++.cc
# Opt level: O0

LogFormat * __thiscall el::base::LogFormat::operator=(LogFormat *this,LogFormat *logFormat)

{
  LogFormat *in_RSI;
  LogFormat *in_RDI;
  
  if (in_RSI != in_RDI) {
    in_RDI->m_level = in_RSI->m_level;
    std::__cxx11::string::operator=((string *)&in_RDI->m_userFormat,(string *)&in_RSI->m_userFormat)
    ;
    std::__cxx11::string::operator=
              ((string *)&in_RDI->m_dateTimeFormat,(string *)&in_RSI->m_dateTimeFormat);
    in_RDI->m_flags = in_RSI->m_flags;
    std::__cxx11::string::operator=
              ((string *)&in_RDI->m_currentUser,(string *)&in_RSI->m_currentUser);
    std::__cxx11::string::operator=
              ((string *)&in_RDI->m_currentHost,(string *)&in_RSI->m_currentHost);
  }
  return in_RDI;
}

Assistant:

LogFormat& LogFormat::operator=(const LogFormat& logFormat) {
  if (&logFormat != this) {
    m_level = logFormat.m_level;
    m_userFormat = logFormat.m_userFormat;
    m_dateTimeFormat = logFormat.m_dateTimeFormat;
    m_flags = logFormat.m_flags;
    m_currentUser = logFormat.m_currentUser;
    m_currentHost = logFormat.m_currentHost;
  }
  return *this;
}